

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  ulong *puVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  undefined8 unaff_R12;
  ulong uVar28;
  Geometry *geometry;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar35 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  vint4 ai_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  float fVar56;
  float fVar62;
  float fVar63;
  vint4 ai_3;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar64;
  vint4 ai;
  undefined1 auVar65 [16];
  vint4 ai_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vint4 ai_4;
  undefined1 auVar71 [16];
  vint4 ai_6;
  undefined1 auVar72 [16];
  float fVar73;
  float fVar75;
  float fVar76;
  undefined1 auVar74 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar81 [32];
  float fVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  ulong *local_ba8;
  undefined1 local_b80 [16];
  ulong *local_b70;
  ulong local_b68;
  ulong local_b60;
  ulong local_b58;
  ulong local_b50;
  ulong local_b48;
  ulong local_b40;
  ulong local_b38;
  ulong local_b30;
  ulong local_b28;
  ulong local_b20;
  ulong local_b18;
  ulong local_b10;
  long local_b08;
  long local_b00;
  long local_af8;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  RTCFilterFunctionNArguments local_a60;
  undefined1 local_a30 [16];
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined4 local_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined1 local_9e0 [16];
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined1 local_990 [16];
  uint local_980;
  uint uStack_97c;
  uint uStack_978;
  uint uStack_974;
  uint uStack_970;
  uint uStack_96c;
  uint uStack_968;
  uint uStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  byte local_8df;
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar90 = ZEXT1664(auVar31);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar91 = ZEXT1664(auVar32);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar92 = ZEXT1664(auVar33);
  auVar31 = vmulss_avx512f(auVar31,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar34._0_4_ = auVar31._0_4_;
  auVar34._4_4_ = auVar34._0_4_;
  auVar34._8_4_ = auVar34._0_4_;
  auVar34._12_4_ = auVar34._0_4_;
  auVar31 = vmulss_avx512f(auVar32,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar32._0_4_ = auVar31._0_4_;
  auVar32._4_4_ = auVar32._0_4_;
  auVar32._8_4_ = auVar32._0_4_;
  auVar32._12_4_ = auVar32._0_4_;
  auVar31 = vmulss_avx512f(auVar33,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar33._0_4_ = auVar31._0_4_;
  auVar33._4_4_ = auVar33._0_4_;
  auVar33._8_4_ = auVar33._0_4_;
  auVar33._12_4_ = auVar33._0_4_;
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = uVar22 ^ 0x10;
  uVar26 = uVar23 ^ 0x10;
  uVar29 = uVar24 ^ 0x10;
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar31 = vxorps_avx512vl(auVar34,auVar66);
  auVar93 = ZEXT1664(auVar31);
  auVar31 = vxorps_avx512vl(auVar32,auVar66);
  auVar94 = ZEXT1664(auVar31);
  auVar31 = vxorps_avx512vl(auVar33,auVar66);
  auVar95 = ZEXT1664(auVar31);
  auVar31 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar96 = ZEXT1664(auVar31);
  auVar31 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar97 = ZEXT1664(auVar31);
  local_b10 = uVar22 >> 2;
  local_b18 = uVar25 >> 2;
  local_b20 = uVar23 >> 2;
  local_b28 = uVar26 >> 2;
  local_b30 = uVar24 >> 2;
  local_b38 = uVar29 >> 2;
  auVar31 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar98 = ZEXT1664(auVar31);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar99 = ZEXT3264(auVar36);
  auVar31 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar100 = ZEXT1664(auVar31);
  puVar16 = local_7f8;
  local_b68 = uVar29;
  local_b60 = uVar26;
  local_b58 = uVar25;
  local_b50 = uVar24;
  local_b48 = uVar23;
  local_b40 = uVar22;
LAB_01cf00af:
  do {
    local_b70 = puVar16;
    if (local_b70 == &local_800) {
LAB_01cf0b39:
      return local_b70 != &local_800;
    }
    local_ba8 = local_b70 + -1;
    uVar28 = local_b70[-1];
    while ((uVar28 & 8) == 0) {
      auVar31 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar22),auVar93._0_16_,
                           auVar90._0_16_);
      auVar32 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar23),auVar94._0_16_,
                           auVar91._0_16_);
      auVar31 = vpmaxsd_avx(auVar31,auVar32);
      auVar33 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar24),auVar95._0_16_,
                           auVar92._0_16_);
      auVar32 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar25),auVar93._0_16_,
                           auVar90._0_16_);
      auVar34 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar26),auVar94._0_16_,
                           auVar91._0_16_);
      auVar32 = vpminsd_avx(auVar32,auVar34);
      auVar34 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar29),auVar95._0_16_,
                           auVar92._0_16_);
      auVar33 = vpmaxsd_avx512vl(auVar33,auVar96._0_16_);
      auVar31 = vpmaxsd_avx(auVar31,auVar33);
      auVar33 = vpminsd_avx512vl(auVar34,auVar97._0_16_);
      auVar32 = vpminsd_avx(auVar32,auVar33);
      uVar30 = vpcmpd_avx512vl(auVar31,auVar32,2);
      uVar30 = uVar30 & 0xf;
      puVar16 = local_ba8;
      if ((char)uVar30 == '\0') goto LAB_01cf00af;
      uVar17 = uVar28 & 0xfffffffffffffff0;
      lVar18 = 0;
      for (uVar28 = uVar30; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar28 = *(ulong *)(uVar17 + lVar18 * 8);
      uVar19 = (uint)uVar30 - 1 & (uint)uVar30;
      uVar30 = (ulong)uVar19;
      if (uVar19 != 0) {
        do {
          *local_ba8 = uVar28;
          local_ba8 = local_ba8 + 1;
          lVar18 = 0;
          for (uVar28 = uVar30; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar30 = uVar30 - 1 & uVar30;
          uVar28 = *(ulong *)(uVar17 + lVar18 * 8);
        } while (uVar30 != 0);
      }
    }
    local_b08 = (ulong)((uint)uVar28 & 0xf) - 8;
    uVar28 = uVar28 & 0xfffffffffffffff0;
    for (local_b00 = 0; puVar16 = local_ba8, local_b00 != local_b08; local_b00 = local_b00 + 1) {
      lVar18 = local_b00 * 0x58;
      local_af8 = lVar18 + uVar28;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(uVar28 + 0x20 + lVar18);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)(uVar28 + 0x24 + lVar18);
      uVar9 = vpcmpub_avx512vl(auVar31,auVar57,2);
      uVar1 = *(undefined4 *)(uVar28 + 0x38 + lVar18);
      auVar51._4_4_ = uVar1;
      auVar51._0_4_ = uVar1;
      auVar51._8_4_ = uVar1;
      auVar51._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar28 + 0x44 + lVar18);
      auVar58._4_4_ = uVar1;
      auVar58._0_4_ = uVar1;
      auVar58._8_4_ = uVar1;
      auVar58._12_4_ = uVar1;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)(local_b10 + 0x20 + local_af8);
      auVar31 = vpmovzxbd_avx(auVar65);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar32 = vfmadd213ps_fma(auVar31,auVar58,auVar51);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)(local_b18 + 0x20 + local_af8);
      auVar31 = vpmovzxbd_avx(auVar67);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar33 = vfmadd213ps_fma(auVar31,auVar58,auVar51);
      uVar1 = *(undefined4 *)(uVar28 + 0x3c + lVar18);
      auVar52._4_4_ = uVar1;
      auVar52._0_4_ = uVar1;
      auVar52._8_4_ = uVar1;
      auVar52._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar28 + 0x48 + lVar18);
      auVar59._4_4_ = uVar1;
      auVar59._0_4_ = uVar1;
      auVar59._8_4_ = uVar1;
      auVar59._12_4_ = uVar1;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(ulong *)(local_b20 + 0x20 + local_af8);
      auVar31 = vpmovzxbd_avx(auVar69);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar34 = vfmadd213ps_fma(auVar31,auVar59,auVar52);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = *(ulong *)(local_b28 + 0x20 + local_af8);
      auVar31 = vpmovzxbd_avx(auVar70);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar66 = vfmadd213ps_fma(auVar31,auVar59,auVar52);
      uVar1 = *(undefined4 *)(uVar28 + 0x40 + lVar18);
      auVar53._4_4_ = uVar1;
      auVar53._0_4_ = uVar1;
      auVar53._8_4_ = uVar1;
      auVar53._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar28 + 0x4c + lVar18);
      auVar60._4_4_ = uVar1;
      auVar60._0_4_ = uVar1;
      auVar60._8_4_ = uVar1;
      auVar60._12_4_ = uVar1;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)(local_b30 + 0x20 + local_af8);
      auVar31 = vpmovzxbd_avx(auVar71);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar51 = vfmadd213ps_fma(auVar31,auVar60,auVar53);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(local_b38 + 0x20 + local_af8);
      auVar31 = vpmovzxbd_avx(auVar72);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar52 = vfmadd213ps_fma(auVar31,auVar60,auVar53);
      auVar31 = vfmadd213ps_avx512vl(auVar32,auVar90._0_16_,auVar93._0_16_);
      auVar32 = vfmadd213ps_avx512vl(auVar34,auVar91._0_16_,auVar94._0_16_);
      auVar31 = vpmaxsd_avx(auVar31,auVar32);
      auVar34 = vfmadd213ps_avx512vl(auVar51,auVar92._0_16_,auVar95._0_16_);
      auVar32 = vfmadd213ps_avx512vl(auVar33,auVar90._0_16_,auVar93._0_16_);
      auVar33 = vfmadd213ps_avx512vl(auVar66,auVar91._0_16_,auVar94._0_16_);
      auVar32 = vpminsd_avx(auVar32,auVar33);
      auVar33 = vfmadd213ps_avx512vl(auVar52,auVar92._0_16_,auVar95._0_16_);
      auVar34 = vpmaxsd_avx512vl(auVar34,auVar96._0_16_);
      auVar31 = vpmaxsd_avx(auVar31,auVar34);
      auVar33 = vpminsd_avx512vl(auVar33,auVar97._0_16_);
      auVar32 = vpminsd_avx(auVar32,auVar33);
      uVar10 = vpcmpd_avx512vl(auVar31,auVar32,2);
      for (uVar22 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),
                             (uint)((byte)uVar9 & 0xf & (byte)uVar10)); uVar22 != 0;
          uVar22 = uVar22 - 1 & uVar22) {
        lVar18 = 0;
        for (uVar23 = uVar22; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          lVar18 = lVar18 + 1;
        }
        pGVar2 = (context->scene->geometries).items[*(uint *)(local_af8 + 0x50)].ptr;
        lVar3 = *(long *)&pGVar2->field_0x58;
        lVar4 = *(long *)&pGVar2[1].time_range.upper;
        lVar21 = pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)*(uint *)(local_af8 + 4 + lVar18 * 8);
        uVar23 = *(ulong *)(local_af8 + lVar18 * 8);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar23;
        auVar31 = vpandq_avx512vl(auVar54,auVar98._0_16_);
        auVar51 = vpmovzxwd_avx(auVar31);
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)(lVar3 + lVar21);
        auVar31 = vpaddd_avx(auVar61,auVar51);
        auVar32 = vpmulld_avx(auVar61,auVar51);
        auVar32 = vpsrlq_avx(auVar32,0x20);
        auVar31 = vpaddd_avx(auVar31,auVar32);
        lVar20 = CONCAT44((int)((ulong)local_af8 >> 0x20),auVar31._0_4_);
        p_Var5 = pGVar2[1].intersectionFilterN;
        auVar31 = *(undefined1 (*) [16])(lVar4 + (lVar20 + 1) * (long)p_Var5);
        uVar25 = *(ulong *)(lVar3 + lVar21) >> 0x20;
        lVar27 = lVar20 + uVar25 + 1;
        auVar32 = *(undefined1 (*) [16])(lVar4 + (lVar20 + uVar25) * (long)p_Var5);
        auVar33 = *(undefined1 (*) [16])(lVar4 + lVar27 * (long)p_Var5);
        uVar24 = (ulong)(-1 < (short)uVar23);
        auVar34 = *(undefined1 (*) [16])(lVar4 + (lVar20 + uVar24 + 1) * (long)p_Var5);
        lVar18 = uVar24 + lVar27;
        auVar66 = *(undefined1 (*) [16])(lVar4 + lVar18 * (long)p_Var5);
        uVar24 = 0;
        if (-1 < (short)(uVar23 >> 0x10)) {
          uVar24 = uVar25;
        }
        auVar52 = *(undefined1 (*) [16])(lVar4 + (lVar20 + uVar25 + uVar24) * (long)p_Var5);
        auVar53 = *(undefined1 (*) [16])(lVar4 + (lVar27 + uVar24) * (long)p_Var5);
        auVar77._16_16_ = *(undefined1 (*) [16])(lVar4 + (uVar24 + lVar18) * (long)p_Var5);
        auVar77._0_16_ = auVar33;
        auVar58 = vunpcklps_avx(auVar31,auVar66);
        auVar57 = vunpckhps_avx(auVar31,auVar66);
        auVar59 = vunpcklps_avx(auVar34,auVar33);
        auVar34 = vunpckhps_avx(auVar34,auVar33);
        auVar60 = vunpcklps_avx(auVar57,auVar34);
        auVar65 = vunpcklps_avx(auVar58,auVar59);
        auVar34 = vunpckhps_avx(auVar58,auVar59);
        auVar58 = vunpcklps_avx(auVar32,auVar53);
        auVar57 = vunpckhps_avx(auVar32,auVar53);
        auVar59 = vunpcklps_avx(auVar33,auVar52);
        auVar52 = vunpckhps_avx(auVar33,auVar52);
        auVar57 = vunpcklps_avx(auVar57,auVar52);
        auVar67 = vunpcklps_avx(auVar58,auVar59);
        auVar52 = vunpckhps_avx(auVar58,auVar59);
        auVar47._16_16_ = auVar53;
        auVar47._0_16_ = auVar32;
        auVar48._16_16_ = auVar66;
        auVar48._0_16_ = auVar31;
        auVar36 = vunpcklps_avx(auVar48,auVar47);
        auVar49._16_16_ = auVar33;
        auVar49._0_16_ = *(undefined1 (*) [16])(lVar4 + (long)p_Var5 * lVar20);
        auVar50 = vunpcklps_avx(auVar49,auVar77);
        auVar40 = vunpcklps_avx(auVar50,auVar36);
        auVar41 = vunpckhps_avx(auVar50,auVar36);
        auVar36 = vunpckhps_avx(auVar48,auVar47);
        auVar50 = vunpckhps_avx(auVar49,auVar77);
        auVar42 = vunpcklps_avx(auVar50,auVar36);
        auVar36._16_16_ = auVar65;
        auVar36._0_16_ = auVar65;
        auVar50._16_16_ = auVar34;
        auVar50._0_16_ = auVar34;
        auVar46._16_16_ = auVar60;
        auVar46._0_16_ = auVar60;
        auVar44._16_16_ = auVar67;
        auVar44._0_16_ = auVar67;
        auVar78._16_16_ = auVar52;
        auVar78._0_16_ = auVar52;
        auVar45._16_16_ = auVar57;
        auVar45._0_16_ = auVar57;
        auVar36 = vsubps_avx(auVar40,auVar36);
        auVar50 = vsubps_avx(auVar41,auVar50);
        auVar49 = vsubps_avx(auVar42,auVar46);
        auVar48 = vsubps_avx(auVar44,auVar40);
        auVar47 = vsubps_avx(auVar78,auVar41);
        auVar46 = vsubps_avx(auVar45,auVar42);
        auVar37._4_4_ = auVar50._4_4_ * auVar46._4_4_;
        auVar37._0_4_ = auVar50._0_4_ * auVar46._0_4_;
        auVar37._8_4_ = auVar50._8_4_ * auVar46._8_4_;
        auVar37._12_4_ = auVar50._12_4_ * auVar46._12_4_;
        auVar37._16_4_ = auVar50._16_4_ * auVar46._16_4_;
        auVar37._20_4_ = auVar50._20_4_ * auVar46._20_4_;
        auVar37._24_4_ = auVar50._24_4_ * auVar46._24_4_;
        auVar37._28_4_ = auVar34._12_4_;
        auVar31 = vfmsub231ps_fma(auVar37,auVar47,auVar49);
        auVar38._4_4_ = auVar49._4_4_ * auVar48._4_4_;
        auVar38._0_4_ = auVar49._0_4_ * auVar48._0_4_;
        auVar38._8_4_ = auVar49._8_4_ * auVar48._8_4_;
        auVar38._12_4_ = auVar49._12_4_ * auVar48._12_4_;
        auVar38._16_4_ = auVar49._16_4_ * auVar48._16_4_;
        auVar38._20_4_ = auVar49._20_4_ * auVar48._20_4_;
        auVar38._24_4_ = auVar49._24_4_ * auVar48._24_4_;
        auVar38._28_4_ = auVar60._12_4_;
        auVar32 = vfmsub231ps_fma(auVar38,auVar46,auVar36);
        auVar43._4_4_ = auVar36._4_4_ * auVar47._4_4_;
        auVar43._0_4_ = auVar36._0_4_ * auVar47._0_4_;
        auVar43._8_4_ = auVar36._8_4_ * auVar47._8_4_;
        auVar43._12_4_ = auVar36._12_4_ * auVar47._12_4_;
        auVar43._16_4_ = auVar36._16_4_ * auVar47._16_4_;
        auVar43._20_4_ = auVar36._20_4_ * auVar47._20_4_;
        auVar43._24_4_ = auVar36._24_4_ * auVar47._24_4_;
        auVar43._28_4_ = auVar67._12_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar81._4_4_ = uVar1;
        auVar81._0_4_ = uVar1;
        auVar81._8_4_ = uVar1;
        auVar81._12_4_ = uVar1;
        auVar81._16_4_ = uVar1;
        auVar81._20_4_ = uVar1;
        auVar81._24_4_ = uVar1;
        auVar81._28_4_ = uVar1;
        auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar39._4_4_ = uVar1;
        auVar39._0_4_ = uVar1;
        auVar39._8_4_ = uVar1;
        auVar39._12_4_ = uVar1;
        auVar39._16_4_ = uVar1;
        auVar39._20_4_ = uVar1;
        auVar39._24_4_ = uVar1;
        auVar39._28_4_ = uVar1;
        auVar39 = vsubps_avx512vl(auVar40,auVar39);
        auVar33 = vfmsub231ps_fma(auVar43,auVar48,auVar50);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar40._4_4_ = uVar1;
        auVar40._0_4_ = uVar1;
        auVar40._8_4_ = uVar1;
        auVar40._12_4_ = uVar1;
        auVar40._16_4_ = uVar1;
        auVar40._20_4_ = uVar1;
        auVar40._24_4_ = uVar1;
        auVar40._28_4_ = uVar1;
        auVar40 = vsubps_avx512vl(auVar41,auVar40);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar41._4_4_ = uVar1;
        auVar41._0_4_ = uVar1;
        auVar41._8_4_ = uVar1;
        auVar41._12_4_ = uVar1;
        auVar41._16_4_ = uVar1;
        auVar41._20_4_ = uVar1;
        auVar41._24_4_ = uVar1;
        auVar41._28_4_ = uVar1;
        auVar41 = vsubps_avx512vl(auVar42,auVar41);
        auVar42 = vmulps_avx512vl(auVar37,auVar41);
        auVar43 = vfmsub231ps_avx512vl(auVar42,auVar40,auVar38);
        auVar42 = vmulps_avx512vl(auVar38,auVar39);
        auVar44 = vfmsub231ps_avx512vl(auVar42,auVar41,auVar81);
        auVar42 = vmulps_avx512vl(auVar81,auVar40);
        auVar45 = vfmsub231ps_avx512vl(auVar42,auVar39,auVar37);
        auVar42 = vmulps_avx512vl(ZEXT1632(auVar33),auVar38);
        auVar42 = vfmadd231ps_avx512vl(auVar42,ZEXT1632(auVar32),auVar37);
        local_900 = vfmadd231ps_avx512vl(auVar42,ZEXT1632(auVar31),auVar81);
        vandps_avx512vl(local_900,auVar99._0_32_);
        auVar42._8_4_ = 0x80000000;
        auVar42._0_8_ = 0x8000000080000000;
        auVar42._12_4_ = 0x80000000;
        auVar42._16_4_ = 0x80000000;
        auVar42._20_4_ = 0x80000000;
        auVar42._24_4_ = 0x80000000;
        auVar42._28_4_ = 0x80000000;
        vandps_avx512vl(local_900,auVar42);
        auVar46 = vmulps_avx512vl(auVar46,auVar45);
        auVar47 = vfmadd231ps_avx512vl(auVar46,auVar44,auVar47);
        auVar48 = vfmadd231ps_avx512vl(auVar47,auVar43,auVar48);
        fVar80 = local_900._0_4_;
        auVar74._0_4_ = (float)((uint)fVar80 ^ auVar48._0_4_);
        fVar82 = local_900._4_4_;
        auVar74._4_4_ = (float)((uint)fVar82 ^ auVar48._4_4_);
        fVar83 = local_900._8_4_;
        auVar74._8_4_ = (float)((uint)fVar83 ^ auVar48._8_4_);
        fVar84 = local_900._12_4_;
        auVar74._12_4_ = (float)((uint)fVar84 ^ auVar48._12_4_);
        fVar85 = local_900._16_4_;
        auVar74._16_4_ = (float)((uint)fVar85 ^ auVar48._16_4_);
        fVar86 = local_900._20_4_;
        auVar74._20_4_ = (float)((uint)fVar86 ^ auVar48._20_4_);
        fVar87 = local_900._24_4_;
        auVar74._24_4_ = (float)((uint)fVar87 ^ auVar48._24_4_);
        uVar19 = local_900._28_4_;
        auVar74._28_4_ = (float)(uVar19 ^ auVar48._28_4_);
        auVar49 = vmulps_avx512vl(auVar49,auVar45);
        auVar50 = vfmadd231ps_avx512vl(auVar49,auVar50,auVar44);
        auVar36 = vfmadd231ps_avx512vl(auVar50,auVar36,auVar43);
        auVar79._0_4_ = (float)((uint)fVar80 ^ auVar36._0_4_);
        auVar79._4_4_ = (float)((uint)fVar82 ^ auVar36._4_4_);
        auVar79._8_4_ = (float)((uint)fVar83 ^ auVar36._8_4_);
        auVar79._12_4_ = (float)((uint)fVar84 ^ auVar36._12_4_);
        auVar79._16_4_ = (float)((uint)fVar85 ^ auVar36._16_4_);
        auVar79._20_4_ = (float)((uint)fVar86 ^ auVar36._20_4_);
        auVar79._24_4_ = (float)((uint)fVar87 ^ auVar36._24_4_);
        auVar79._28_4_ = (float)(uVar19 ^ auVar36._28_4_);
        uVar9 = vcmpps_avx512vl(auVar74,ZEXT832(0) << 0x20,5);
        uVar10 = vcmpps_avx512vl(auVar79,ZEXT832(0) << 0x20,5);
        uVar7 = vcmpps_avx512vl(local_900,ZEXT832(0) << 0x20,4);
        auVar89._0_4_ = auVar74._0_4_ + auVar79._0_4_;
        auVar89._4_4_ = auVar74._4_4_ + auVar79._4_4_;
        auVar89._8_4_ = auVar74._8_4_ + auVar79._8_4_;
        auVar89._12_4_ = auVar74._12_4_ + auVar79._12_4_;
        auVar89._16_4_ = auVar74._16_4_ + auVar79._16_4_;
        auVar89._20_4_ = auVar74._20_4_ + auVar79._20_4_;
        auVar89._24_4_ = auVar74._24_4_ + auVar79._24_4_;
        auVar89._28_4_ = auVar74._28_4_ + auVar79._28_4_;
        uVar8 = vcmpps_avx512vl(auVar89,local_900,2);
        local_8df = (byte)uVar9 & (byte)uVar10 & (byte)uVar7 & (byte)uVar8;
        if (local_8df != 0) {
          auVar13._4_4_ = auVar33._4_4_ * auVar41._4_4_;
          auVar13._0_4_ = auVar33._0_4_ * auVar41._0_4_;
          auVar13._8_4_ = auVar33._8_4_ * auVar41._8_4_;
          auVar13._12_4_ = auVar33._12_4_ * auVar41._12_4_;
          auVar13._16_4_ = auVar41._16_4_ * 0.0;
          auVar13._20_4_ = auVar41._20_4_ * 0.0;
          auVar13._24_4_ = auVar41._24_4_ * 0.0;
          auVar13._28_4_ = auVar41._28_4_;
          auVar34 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar32),auVar13);
          auVar34 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar31),ZEXT1632(auVar34));
          local_920._0_4_ = (float)((uint)fVar80 ^ auVar34._0_4_);
          local_920._4_4_ = (float)((uint)fVar82 ^ auVar34._4_4_);
          local_920._8_4_ = (float)((uint)fVar83 ^ auVar34._8_4_);
          local_920._12_4_ = (float)((uint)fVar84 ^ auVar34._12_4_);
          local_920._16_4_ = fVar85;
          local_920._20_4_ = fVar86;
          local_920._24_4_ = fVar87;
          local_920._28_4_ = uVar19;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar11._4_4_ = uVar1;
          auVar11._0_4_ = uVar1;
          auVar11._8_4_ = uVar1;
          auVar11._12_4_ = uVar1;
          auVar11._16_4_ = uVar1;
          auVar11._20_4_ = uVar1;
          auVar11._24_4_ = uVar1;
          auVar11._28_4_ = uVar1;
          auVar36 = vmulps_avx512vl(local_900,auVar11);
          uVar9 = vcmpps_avx512vl(auVar36,local_920,1);
          fVar88 = *(float *)(ray + k * 4 + 0x80);
          auVar14._4_4_ = fVar88 * fVar82;
          auVar14._0_4_ = fVar88 * fVar80;
          auVar14._8_4_ = fVar88 * fVar83;
          auVar14._12_4_ = fVar88 * fVar84;
          auVar14._16_4_ = fVar88 * fVar85;
          auVar14._20_4_ = fVar88 * fVar86;
          auVar14._24_4_ = fVar88 * fVar87;
          auVar14._28_4_ = auVar36._28_4_;
          uVar10 = vcmpps_avx512vl(local_920,auVar14,2);
          local_8df = (byte)uVar9 & (byte)uVar10 & local_8df;
          if (local_8df != 0) {
            auVar36 = vsubps_avx(local_900,auVar79);
            local_960 = vblendps_avx(auVar74,auVar36,0xf0);
            auVar36 = vsubps_avx(local_900,auVar74);
            local_940 = vblendps_avx(auVar79,auVar36,0xf0);
            fVar73 = (float)DAT_01fbac00;
            local_860._0_4_ = fVar73 * auVar31._0_4_;
            fVar75 = DAT_01fbac00._4_4_;
            local_860._4_4_ = fVar75 * auVar31._4_4_;
            fVar56 = DAT_01fbac00._8_4_;
            local_860._8_4_ = fVar56 * auVar31._8_4_;
            fVar62 = DAT_01fbac00._12_4_;
            local_860._12_4_ = fVar62 * auVar31._12_4_;
            fVar63 = DAT_01fbac00._16_4_;
            local_860._16_4_ = fVar63 * 0.0;
            fVar64 = DAT_01fbac00._20_4_;
            local_860._20_4_ = fVar64 * 0.0;
            fVar76 = DAT_01fbac00._24_4_;
            local_860._24_4_ = fVar76 * 0.0;
            local_860._28_4_ = 0;
            local_840._4_4_ = fVar75 * auVar32._4_4_;
            local_840._0_4_ = fVar73 * auVar32._0_4_;
            local_840._8_4_ = fVar56 * auVar32._8_4_;
            local_840._12_4_ = fVar62 * auVar32._12_4_;
            local_840._16_4_ = fVar63 * 0.0;
            local_840._20_4_ = fVar64 * 0.0;
            local_840._24_4_ = fVar76 * 0.0;
            local_840._28_4_ = 0;
            local_820._4_4_ = fVar75 * auVar33._4_4_;
            local_820._0_4_ = fVar73 * auVar33._0_4_;
            local_820._8_4_ = fVar56 * auVar33._8_4_;
            local_820._12_4_ = fVar62 * auVar33._12_4_;
            local_820._16_4_ = fVar63 * 0.0;
            local_820._20_4_ = fVar64 * 0.0;
            local_820._24_4_ = fVar76 * 0.0;
            local_820._28_4_ = 0;
            if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01cf0b28:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01cf0b39;
              }
              auVar68._8_4_ = 1;
              auVar68._0_8_ = 0x100000001;
              auVar68._12_4_ = 1;
              auVar68._16_4_ = 1;
              auVar68._20_4_ = 1;
              auVar68._24_4_ = 1;
              auVar68._28_4_ = 1;
              auVar36 = vpermd_avx2(auVar68,ZEXT1632(auVar51));
              auVar50 = vpaddd_avx2(auVar36,_DAT_01fb7760);
              auVar55._0_4_ = auVar51._0_4_;
              auVar55._4_4_ = auVar55._0_4_;
              auVar55._8_4_ = auVar55._0_4_;
              auVar55._12_4_ = auVar55._0_4_;
              auVar55._16_4_ = auVar55._0_4_;
              auVar55._20_4_ = auVar55._0_4_;
              auVar55._24_4_ = auVar55._0_4_;
              auVar55._28_4_ = auVar55._0_4_;
              auVar36 = vpaddd_avx2(auVar55,_DAT_01fb7740);
              local_a70 = auVar90._0_16_;
              auVar31 = vcvtsi2ss_avx512f(local_a70,*(ushort *)(lVar3 + 8 + lVar21) - 1);
              auVar15._12_4_ = 0;
              auVar15._0_12_ = ZEXT812(0);
              auVar32 = vrcp14ss_avx512f(auVar15 << 0x20,ZEXT416(auVar31._0_4_));
              auVar31 = vfnmadd213ss_fma(auVar31,auVar32,SUB6416(ZEXT464(0x40000000),0));
              fVar73 = auVar32._0_4_ * auVar31._0_4_;
              auVar31 = vcvtsi2ss_avx512f(local_a70,*(ushort *)(lVar3 + 10 + lVar21) - 1);
              auVar32 = vrcp14ss_avx512f(auVar15 << 0x20,ZEXT416(auVar31._0_4_));
              auVar31 = vfnmadd213ss_fma(auVar31,auVar32,SUB6416(ZEXT464(0x40000000),0));
              fVar75 = auVar32._0_4_ * auVar31._0_4_;
              auVar36 = vcvtdq2ps_avx(auVar36);
              fStack_8a4 = auVar36._28_4_ + local_960._28_4_;
              auVar50 = vcvtdq2ps_avx(auVar50);
              auVar49 = vrcp14ps_avx512vl(local_900);
              auVar12._8_4_ = 0x3f800000;
              auVar12._0_8_ = 0x3f8000003f800000;
              auVar12._12_4_ = 0x3f800000;
              auVar12._16_4_ = 0x3f800000;
              auVar12._20_4_ = 0x3f800000;
              auVar12._24_4_ = 0x3f800000;
              auVar12._28_4_ = 0x3f800000;
              auVar48 = vfnmadd213ps_avx512vl(local_900,auVar49,auVar12);
              auVar31 = vfmadd132ps_fma(auVar48,auVar49,auVar49);
              fVar56 = auVar31._0_4_;
              fVar62 = auVar31._4_4_;
              local_880._4_4_ = fVar62 * local_920._4_4_;
              local_880._0_4_ = fVar56 * local_920._0_4_;
              fVar63 = auVar31._8_4_;
              local_880._8_4_ = fVar63 * local_920._8_4_;
              fVar64 = auVar31._12_4_;
              local_880._12_4_ = fVar64 * local_920._12_4_;
              local_880._16_4_ = fVar85 * 0.0;
              local_880._20_4_ = fVar86 * 0.0;
              local_880._24_4_ = fVar87 * 0.0;
              local_880._28_4_ = uVar19;
              local_8c0[0] = (fVar80 * auVar36._0_4_ + local_960._0_4_) * fVar73 * fVar56;
              local_8c0[1] = (fVar82 * auVar36._4_4_ + local_960._4_4_) * fVar73 * fVar62;
              local_8c0[2] = (fVar83 * auVar36._8_4_ + local_960._8_4_) * fVar73 * fVar63;
              local_8c0[3] = (fVar84 * auVar36._12_4_ + local_960._12_4_) * fVar73 * fVar64;
              fStack_8b0 = (fVar85 * auVar36._16_4_ + local_960._16_4_) * fVar73 * 0.0;
              fStack_8ac = (fVar86 * auVar36._20_4_ + local_960._20_4_) * fVar73 * 0.0;
              fStack_8a8 = (fVar87 * auVar36._24_4_ + local_960._24_4_) * fVar73 * 0.0;
              local_8a0[0] = (fVar80 * auVar50._0_4_ + local_940._0_4_) * fVar75 * fVar56;
              local_8a0[1] = (fVar82 * auVar50._4_4_ + local_940._4_4_) * fVar75 * fVar62;
              local_8a0[2] = (fVar83 * auVar50._8_4_ + local_940._8_4_) * fVar75 * fVar63;
              local_8a0[3] = (fVar84 * auVar50._12_4_ + local_940._12_4_) * fVar75 * fVar64;
              fStack_890 = (fVar85 * auVar50._16_4_ + local_940._16_4_) * fVar75 * 0.0;
              fStack_88c = (fVar86 * auVar50._20_4_ + local_940._20_4_) * fVar75 * 0.0;
              fStack_888 = (fVar87 * auVar50._24_4_ + local_940._24_4_) * fVar75 * 0.0;
              fStack_884 = fStack_8a4;
              uVar23 = 0;
              uVar25 = (ulong)local_8df;
              for (uVar24 = uVar25; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                uVar23 = uVar23 + 1;
              }
              auVar31 = vpbroadcastd_avx512vl();
              local_a30 = vpbroadcastd_avx512vl();
              local_a80 = auVar91._0_16_;
              local_a90 = auVar92._0_16_;
              local_aa0 = auVar93._0_16_;
              local_ab0 = auVar94._0_16_;
              local_ac0 = auVar95._0_16_;
              local_ad0 = vmovdqa64_avx512vl(auVar96._0_16_);
              local_ae0 = vmovdqa64_avx512vl(auVar97._0_16_);
              local_af0 = vmovdqa64_avx512vl(auVar100._0_16_);
              local_a20 = fVar88;
              fStack_a1c = fVar88;
              fStack_a18 = fVar88;
              fStack_a14 = fVar88;
              fStack_a10 = fVar88;
              fStack_a0c = fVar88;
              fStack_a08 = fVar88;
              fStack_a04 = fVar88;
              while (uVar25 != 0) {
                fVar80 = local_8c0[uVar23];
                local_9c0._4_4_ = fVar80;
                local_9c0._0_4_ = fVar80;
                local_9c0._8_4_ = fVar80;
                local_9c0._12_4_ = fVar80;
                fVar80 = local_8a0[uVar23];
                local_9b0._4_4_ = fVar80;
                local_9b0._0_4_ = fVar80;
                local_9b0._8_4_ = fVar80;
                local_9b0._12_4_ = fVar80;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_880 + uVar23 * 4);
                local_a60.context = context->user;
                local_9f0 = *(undefined4 *)(local_860 + uVar23 * 4);
                uVar1 = *(undefined4 *)(local_840 + uVar23 * 4);
                local_9e0._4_4_ = uVar1;
                local_9e0._0_4_ = uVar1;
                local_9e0._8_4_ = uVar1;
                local_9e0._12_4_ = uVar1;
                local_9d0 = *(undefined4 *)(local_820 + uVar23 * 4);
                local_9a0 = local_a30._0_8_;
                uStack_998 = local_a30._8_8_;
                vpcmpeqd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar31));
                uStack_97c = (local_a60.context)->instID[0];
                local_980 = uStack_97c;
                uStack_978 = uStack_97c;
                uStack_974 = uStack_97c;
                uStack_970 = (local_a60.context)->instPrimID[0];
                uStack_96c = uStack_970;
                uStack_968 = uStack_970;
                uStack_964 = uStack_970;
                local_b80 = vmovdqa64_avx512vl(auVar100._0_16_);
                local_a60.valid = (int *)local_b80;
                local_a60.geometryUserPtr = pGVar2->userPtr;
                local_a60.hit = (RTCHitN *)&local_9f0;
                local_a60.N = 4;
                auVar32 = vmovdqa64_avx512vl(auVar100._0_16_);
                local_a60.ray = (RTCRayN *)ray;
                uStack_9ec = local_9f0;
                uStack_9e8 = local_9f0;
                uStack_9e4 = local_9f0;
                uStack_9cc = local_9d0;
                uStack_9c8 = local_9d0;
                uStack_9c4 = local_9d0;
                local_990 = auVar31;
                if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar2->occlusionFilterN)(&local_a60);
                  auVar32 = vmovdqa64_avx512vl(local_af0);
                  auVar100 = ZEXT1664(auVar32);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar99 = ZEXT3264(auVar36);
                  auVar32 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                  auVar98 = ZEXT1664(auVar32);
                  auVar32 = vmovdqa64_avx512vl(local_ae0);
                  auVar97 = ZEXT1664(auVar32);
                  auVar32 = vmovdqa64_avx512vl(local_ad0);
                  auVar96 = ZEXT1664(auVar32);
                  auVar95 = ZEXT1664(local_ac0);
                  auVar94 = ZEXT1664(local_ab0);
                  auVar93 = ZEXT1664(local_aa0);
                  auVar92 = ZEXT1664(local_a90);
                  auVar91 = ZEXT1664(local_a80);
                  auVar90 = ZEXT1664(local_a70);
                  auVar32 = local_b80;
                  fVar88 = local_a20;
                }
                uVar24 = vptestmd_avx512vl(auVar32,auVar32);
                if ((uVar24 & 0xf) != 0) {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&local_a60);
                    auVar32 = vmovdqa64_avx512vl(local_af0);
                    auVar100 = ZEXT1664(auVar32);
                    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar99 = ZEXT3264(auVar36);
                    auVar32 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                    auVar98 = ZEXT1664(auVar32);
                    auVar32 = vmovdqa64_avx512vl(local_ae0);
                    auVar97 = ZEXT1664(auVar32);
                    auVar32 = vmovdqa64_avx512vl(local_ad0);
                    auVar96 = ZEXT1664(auVar32);
                    auVar95 = ZEXT1664(local_ac0);
                    auVar94 = ZEXT1664(local_ab0);
                    auVar93 = ZEXT1664(local_aa0);
                    auVar92 = ZEXT1664(local_a90);
                    auVar91 = ZEXT1664(local_a80);
                    auVar90 = ZEXT1664(local_a70);
                    fVar88 = local_a20;
                    auVar32 = local_b80;
                  }
                  uVar24 = vptestmd_avx512vl(auVar32,auVar32);
                  uVar24 = uVar24 & 0xf;
                  auVar32 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar6 = (bool)((byte)uVar24 & 1);
                  auVar35._0_4_ =
                       (uint)bVar6 * auVar32._0_4_ | (uint)!bVar6 * *(int *)(local_a60.ray + 0x80);
                  bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                  auVar35._4_4_ =
                       (uint)bVar6 * auVar32._4_4_ | (uint)!bVar6 * *(int *)(local_a60.ray + 0x84);
                  bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                  auVar35._8_4_ =
                       (uint)bVar6 * auVar32._8_4_ | (uint)!bVar6 * *(int *)(local_a60.ray + 0x88);
                  bVar6 = SUB81(uVar24 >> 3,0);
                  auVar35._12_4_ =
                       (uint)bVar6 * auVar32._12_4_ | (uint)!bVar6 * *(int *)(local_a60.ray + 0x8c);
                  *(undefined1 (*) [16])(local_a60.ray + 0x80) = auVar35;
                  if ((byte)uVar24 != 0) goto LAB_01cf0b28;
                }
                *(float *)(ray + k * 4 + 0x80) = fVar88;
                uVar24 = uVar23 & 0x3f;
                uVar23 = 0;
                uVar25 = uVar25 ^ 1L << uVar24;
                for (uVar24 = uVar25; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000)
                {
                  uVar23 = uVar23 + 1;
                }
              }
            }
          }
        }
      }
      unaff_R12 = 0;
      uVar22 = local_b40;
      uVar23 = local_b48;
      uVar24 = local_b50;
      uVar25 = local_b58;
      uVar26 = local_b60;
      uVar29 = local_b68;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }